

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O2

void __thiscall parser::memo::any::of<hwl::Variable>::~of(of<hwl::Variable> *this)

{
  ~of(this);
  operator_delete(this,0x48);
  return;
}

Assistant:

of (const T& v) : v(v) {}